

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O0

ts_nsec timed_fdb_iterator_close(fdb_iterator *it)

{
  fdb_status fVar1;
  fdb_iterator *iterator;
  ts_nsec end_00;
  fdb_status status;
  ts_nsec end;
  ts_nsec start;
  undefined8 local_8;
  
  iterator = (fdb_iterator *)get_monotonic_ts();
  fVar1 = fdb_iterator_close(iterator);
  end_00 = get_monotonic_ts();
  if (fVar1 == FDB_RESULT_SUCCESS) {
    local_8 = ts_diff((ts_nsec)iterator,end_00);
  }
  else {
    local_8 = 0xffffffff;
  }
  return local_8;
}

Assistant:

ts_nsec timed_fdb_iterator_close(fdb_iterator *it){

    ts_nsec start, end;
    fdb_status status;

    start = get_monotonic_ts();
    status = fdb_iterator_close(it);
    end = get_monotonic_ts();

    if(status == FDB_RESULT_SUCCESS){
      return ts_diff(start, end);
    } else {
      return ERR_NS;
    }

}